

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O1

void __thiscall Assimp::MemoryIOSystem::Close(MemoryIOSystem *this,IOStream *pFile)

{
  IOStream **__src;
  pointer *pppIVar1;
  IOStream **ppIVar2;
  IOSystem *pIVar3;
  __normal_iterator<Assimp::IOStream_**,_std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>_>
  __dest;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<Assimp::IOStream**,std::vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::IOStream*const>>
                     ((this->created_streams).
                      super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (this->created_streams).
                      super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  if (__dest._M_current ==
      (this->created_streams).
      super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pIVar3 = this->existing_io;
    if (pIVar3 != (IOSystem *)0x0) {
      (*pIVar3->_vptr_IOSystem[5])(pIVar3,pFile);
    }
  }
  else {
    if (pFile != (IOStream *)0x0) {
      (*pFile->_vptr_IOStream[1])();
    }
    __src = __dest._M_current + 1;
    ppIVar2 = (this->created_streams).
              super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__src != ppIVar2) {
      memmove(__dest._M_current,__src,(long)ppIVar2 - (long)__src);
    }
    pppIVar1 = &(this->created_streams).
                super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + -1;
  }
  return;
}

Assistant:

void Close( IOStream* pFile) override {
        auto it = std::find(created_streams.begin(), created_streams.end(), pFile);
        if (it != created_streams.end()) {
            delete pFile;
            created_streams.erase(it);
        } else if (existing_io) {
            existing_io->Close(pFile);
        }
    }